

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

uint xmlDictHashName(uint seed,xmlChar *data,size_t maxLen,size_t *plen)

{
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  uVar1 = seed ^ 0x3b00;
  uVar2 = seed << 0xf | seed >> 0x11;
  sVar3 = 0;
  sVar4 = sVar3;
  if (maxLen != 0) {
    do {
      sVar4 = sVar3;
      if (data[sVar3] == 0) break;
      uVar1 = (uVar1 + data[sVar3]) * 9;
      uVar2 = ((uVar2 + uVar1) * 0x80 | uVar2 + uVar1 >> 0x19) * 5;
      sVar3 = sVar3 + 1;
      sVar4 = maxLen;
    } while (maxLen != sVar3);
  }
  uVar1 = (uVar2 << 0xe | uVar2 >> 0x12) + (uVar1 ^ uVar2);
  uVar2 = (uVar1 * 0x4000000 | uVar1 >> 6) + (uVar2 ^ uVar1);
  uVar1 = (uVar2 * 0x20 | uVar2 >> 0x1b) + (uVar1 ^ uVar2);
  *plen = sVar4;
  return (uVar1 * 0x1000000 | uVar1 >> 8) + (uVar2 ^ uVar1) | 0x80000000;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static unsigned
xmlDictHashName(unsigned seed, const xmlChar* data, size_t maxLen,
                size_t *plen) {
    unsigned h1, h2;
    size_t i;

    HASH_INIT(h1, h2, seed);

    for (i = 0; i < maxLen && data[i]; i++) {
        HASH_UPDATE(h1, h2, data[i]);
    }

    HASH_FINISH(h1, h2);

    *plen = i;
    return(h2 | MAX_HASH_SIZE);
}